

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo_linux.cpp
# Opt level: O3

QString * decodeFsEncString(QString *__return_storage_ptr__,QString *str)

{
  char16_t cVar1;
  Data *pDVar2;
  ulong uVar3;
  char16_t *pcVar4;
  QString *extraout_RAX;
  QString *pQVar5;
  ulong alloc;
  uint uVar6;
  uint uVar7;
  ulong size;
  
  uVar3 = QString::indexOf(str,(QChar)0x5c,0,CaseSensitive);
  if ((long)uVar3 < 0) {
    pDVar2 = (str->d).d;
    pcVar4 = (str->d).ptr;
    (str->d).d = (Data *)0x0;
    (str->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = pcVar4;
    pQVar5 = (QString *)(str->d).size;
    (str->d).size = 0;
    (__return_storage_ptr__->d).size = (qsizetype)pQVar5;
  }
  else {
    pDVar2 = (str->d).d;
    (str->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar2;
    pcVar4 = (str->d).ptr;
    (str->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).ptr = pcVar4;
    alloc = (str->d).size;
    (str->d).size = 0;
    (__return_storage_ptr__->d).size = alloc;
    if ((pDVar2 == (Data *)0x0) ||
       (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QString::reallocData(__return_storage_ptr__,alloc,KeepSize);
      pcVar4 = (__return_storage_ptr__->d).ptr;
      alloc = (__return_storage_ptr__->d).size;
    }
    size = uVar3;
    if (uVar3 < alloc) {
      do {
        if (((long)uVar3 < (long)(alloc - 3)) && (pcVar4[uVar3 + 1] == L'x')) {
          cVar1 = pcVar4[uVar3 + 2];
          uVar6 = (ushort)cVar1 - 0x30;
          if (9 < uVar6) {
            if ((ushort)cVar1 - 0x41 < 6) {
              uVar6 = (ushort)cVar1 - 0x37;
            }
            else {
              uVar6 = (ushort)cVar1 - 0x57;
              if (5 < (ushort)cVar1 - 0x61) {
                uVar6 = 0xffffffff;
              }
            }
          }
          cVar1 = pcVar4[uVar3 + 3];
          uVar7 = (ushort)cVar1 - 0x30;
          if (9 < uVar7) {
            if ((ushort)cVar1 - 0x41 < 6) {
              uVar7 = (ushort)cVar1 - 0x37;
            }
            else {
              uVar7 = (ushort)cVar1 - 0x57;
              if (5 < (ushort)cVar1 - 0x61) {
                uVar7 = 0xffffffff;
              }
            }
          }
          uVar7 = uVar6 << 4 | uVar7;
          if ((int)uVar7 < 0) {
            uVar7 = 0xfffd;
          }
          pcVar4[size] = (char16_t)uVar7;
          size = size + 1;
          uVar3 = uVar3 + 4;
        }
        if ((long)uVar3 < (long)alloc) {
          while (pcVar4[uVar3] != L'\\') {
            pcVar4[size] = pcVar4[uVar3];
            size = size + 1;
            uVar3 = uVar3 + 1;
            if (alloc == uVar3) goto LAB_00441651;
          }
        }
      } while ((long)uVar3 < (long)alloc);
    }
LAB_00441651:
    QString::resize(__return_storage_ptr__,size);
    pQVar5 = extraout_RAX;
  }
  return pQVar5;
}

Assistant:

static QString decodeFsEncString(QString &&str)
{
    using namespace QtMiscUtils;
    qsizetype start = str.indexOf(u'\\');
    if (start < 0)
        return std::move(str);

    // decode in-place
    QString decoded = std::move(str);
    auto ptr = reinterpret_cast<char16_t *>(decoded.begin());
    qsizetype in = start;
    qsizetype out = start;
    qsizetype size = decoded.size();

    while (in < size) {
        Q_ASSERT(ptr[in] == u'\\');
        if (size - in >= 4 && ptr[in + 1] == u'x') {    // we need four characters: \xAB
            int c = fromHex(ptr[in + 2]) << 4;
            c |= fromHex(ptr[in + 3]);
            if (Q_UNLIKELY(c < 0))
                c = QChar::ReplacementCharacter;        // bad hex sequence
            ptr[out++] = c;
            in += 4;
        }

        for ( ; in < size; ++in) {
            char16_t c = ptr[in];
            if (c == u'\\')
                break;
            ptr[out++] = c;
        }
    }
    decoded.resize(out);
    return decoded;
}